

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mshinfo.c
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  char *pcVar5;
  char *pcVar6;
  ulong uVar7;
  ulong uVar8;
  int64_t iVar9;
  size_t sVar10;
  int64_t iVar11;
  int64_t iVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  int FilVer;
  int dim;
  double local_19c0;
  int NmbNod;
  int deg;
  int ite;
  int64_t local_19a8;
  int64_t local_19a0;
  int64_t local_1998;
  int64_t local_1990;
  int64_t local_1988;
  int64_t local_1980;
  int64_t local_1978;
  int64_t local_1970;
  int64_t local_1968;
  int64_t local_1960;
  int64_t local_1958;
  int64_t local_1950;
  int64_t local_1948;
  int64_t local_1940;
  int64_t local_1938;
  int64_t local_1930;
  int64_t local_1928;
  int64_t local_1920;
  int64_t local_1918;
  int64_t local_1910;
  int64_t local_1908;
  int64_t local_1900;
  int NbrTyp;
  int64_t local_18f0;
  int64_t local_18e8;
  int64_t local_18e0;
  int64_t local_18d8;
  int64_t local_18d0;
  int64_t local_18c8;
  int64_t local_18c0;
  int64_t local_18b8;
  int64_t local_18b0;
  int64_t local_18a8;
  int64_t local_18a0;
  int64_t local_1898;
  int64_t local_1890;
  int64_t local_1888;
  int64_t local_1880;
  int64_t local_1878;
  int64_t local_1870;
  int64_t local_1868;
  int64_t local_1860;
  ulong local_1858;
  int64_t local_1850;
  int64_t local_1848;
  int64_t local_1840;
  int64_t local_1838;
  int64_t local_1830;
  int64_t local_1828;
  int64_t local_1820;
  int64_t local_1818;
  ulong local_1810;
  ulong local_1808;
  ulong local_1800;
  ulong local_17f8;
  char **local_17f0;
  float flt;
  undefined4 uStack_17e4;
  int SolSiz;
  char sol [1024];
  char name [1024];
  int TypTab [1000];
  
  ite = 0;
  deg = 1;
  NmbNod = 0;
  if (argc < 2) {
    puts(" USAGE : mshinfo name [-check]");
    goto LAB_001074c3;
  }
  pcVar6 = argv[1];
  local_17f0 = argv;
  strcpy(name,pcVar6);
  strcpy(sol,pcVar6);
  pcVar5 = strstr(name,".mesh");
  pcVar6 = strstr(name,".sol");
  if (pcVar6 == (char *)0x0) {
    if (pcVar5 == (char *)0x0) {
      sVar10 = strlen(name);
      builtin_strncpy(name + sVar10,".meshb",7);
      iVar12 = GmfOpenMesh(name,1,&FilVer,&dim);
      if (iVar12 == 0) {
        sVar10 = strlen(name);
        pcVar5 = name + ((int)sVar10 + -1);
        goto LAB_001063ec;
      }
LAB_0010645e:
      puts("Mesh informations :");
      uVar13 = GmfStatKwd(iVar12,4);
      local_1838 = GmfStatKwd(iVar12,0xd);
      local_19a8 = GmfStatKwd(iVar12,0xe);
      uVar7 = GmfStatKwd(iVar12,8);
      local_1920 = GmfStatKwd(iVar12,10);
      local_1970 = GmfStatKwd(iVar12,0x31);
      local_1948 = GmfStatKwd(iVar12,9);
      uVar8 = GmfStatKwd(iVar12,6);
      local_19a0 = GmfStatKwd(iVar12,7);
      local_1858 = GmfStatKwd(iVar12,5);
      local_18b8 = GmfStatKwd(iVar12,0x1e);
      local_1910 = GmfStatKwd(iVar12,0x21);
      local_1960 = GmfStatKwd(iVar12,0x57);
      local_1938 = GmfStatKwd(iVar12,0x56);
      local_18c0 = GmfStatKwd(iVar12,0x18);
      local_1990 = GmfStatKwd(iVar12,0x1b);
      local_18c8 = GmfStatKwd(iVar12,0x19);
      local_1888 = GmfStatKwd(iVar12,0x60);
      local_19c0 = (double)GmfStatKwd(iVar12,0x62);
      local_1950 = GmfStatKwd(iVar12,100);
      local_1928 = GmfStatKwd(iVar12,0x66);
      local_1890 = GmfStatKwd(iVar12,0x5a);
      local_1980 = GmfStatKwd(iVar12,0x58);
      local_1898 = GmfStatKwd(iVar12,0x5c);
      local_1810 = GmfStatKwd(iVar12,0x61);
      local_17f8 = GmfStatKwd(iVar12,99);
      local_1800 = GmfStatKwd(iVar12,0x65);
      local_1808 = GmfStatKwd(iVar12,0x67);
      local_1860 = GmfStatKwd(iVar12,0x5b);
      local_1978 = GmfStatKwd(iVar12,0x59);
      local_1868 = GmfStatKwd(iVar12,0x5d);
      local_18e8 = GmfStatKwd(iVar12,0x93);
      local_1848 = GmfStatKwd(iVar12,0x99);
      local_1840 = GmfStatKwd(iVar12,0x95);
      local_1850 = GmfStatKwd(iVar12,0x97);
      local_18f0 = GmfStatKwd(iVar12,0x8f);
      iVar9 = GmfStatKwd(iVar12,0x91);
      iVar11 = GmfStatKwd(iVar12,0x8d);
      local_18d0 = GmfStatKwd(iVar12,0x85);
      local_1918 = GmfStatKwd(iVar12,0x8b);
      local_1968 = GmfStatKwd(iVar12,0x87);
      local_1940 = GmfStatKwd(iVar12,0x89);
      local_18d8 = GmfStatKwd(iVar12,0x81);
      local_1998 = GmfStatKwd(iVar12,0x83);
      local_18e0 = GmfStatKwd(iVar12,0x7f);
      local_18a0 = GmfStatKwd(iVar12,0x86);
      local_1908 = GmfStatKwd(iVar12,0x8c);
      local_1958 = GmfStatKwd(iVar12,0x88);
      local_1930 = GmfStatKwd(iVar12,0x8a);
      local_18a8 = GmfStatKwd(iVar12,0x82);
      local_1988 = GmfStatKwd(iVar12,0x84);
      local_18b0 = GmfStatKwd(iVar12,0x80);
      local_1870 = GmfStatKwd(iVar12,0x94);
      local_1828 = GmfStatKwd(iVar12,0x9a);
      local_1818 = GmfStatKwd(iVar12,0x96);
      local_1830 = GmfStatKwd(iVar12,0x98);
      local_1878 = GmfStatKwd(iVar12,0x90);
      local_1820 = GmfStatKwd(iVar12,0x92);
      local_1900 = iVar12;
      local_1880 = GmfStatKwd(iVar12,0x8e);
      printf("version = %d; dim = %d; nbv = %d; (nbc = %d)\n",(ulong)(uint)FilVer,(ulong)(uint)dim,
             uVar13 & 0xffffffff,local_1838);
      uVar13 = local_1858;
      bVar1 = 0 < (int)uVar7;
      bVar2 = 0 < (int)uVar8;
      bVar3 = 0 < (int)local_1858;
      if ((((bVar3 || (bVar2 || bVar1)) || (0 < (int)local_1920)) || (0 < (int)local_1948)) ||
         ((0 < (int)local_1970 || (0 < (int)local_19a0)))) {
        puts("P1/Q1 elements :");
        if (bVar3 || (bVar2 || bVar1)) {
          printf("nbtet = %d; nbtri = %d; nbedg = %d; (nbrdg = %d)\n",uVar7 & 0xffffffff,
                 uVar8 & 0xffffffff,uVar13 & 0xffffffff,local_19a8);
        }
        if ((0 < (int)local_1970 || 0 < (int)local_19a0) ||
            (0 < (int)local_1920 || 0 < (int)local_1948)) {
          printf("nbhex = %d; nbpri = %d; nbpyr = %d; nbqua = %d\n",local_1920,local_1948,local_1970
                 ,local_19a0);
        }
      }
      bVar1 = 0 < (int)local_18e8;
      bVar2 = 0 < (int)local_18f0;
      iVar19 = (int)iVar11;
      iVar18 = (int)local_1848;
      iVar15 = (int)local_1850;
      iVar17 = (int)local_1840;
      iVar14 = (int)iVar9;
      if (((0 < iVar19 || (bVar2 || bVar1)) || (0 < iVar18)) ||
         ((0 < iVar15 || ((0 < iVar17 || (0 < iVar14)))))) {
        puts("P1/Q1 ordering :");
        if (0 < iVar19 || (bVar2 || bVar1)) {
          if (0 < (int)local_18e8) {
            printf("tet ");
          }
          if (0 < (int)local_18f0) {
            printf("tri ");
          }
          if (0 < iVar19) {
            printf("edg ");
          }
          putchar(10);
        }
        if ((0 < iVar17 || 0 < iVar14) || (0 < iVar18 || 0 < iVar15)) {
          if (0 < iVar18) {
            printf("hex ");
          }
          if (0 < iVar15) {
            printf("pri ");
          }
          if (0 < iVar17) {
            printf("pyr ");
          }
          if (0 < iVar14) {
            printf("qua ");
          }
          putchar(10);
        }
      }
      uVar4 = local_17f8;
      uVar8 = local_1800;
      uVar7 = local_1808;
      uVar13 = local_1810;
      iVar12 = local_1900;
      bVar1 = 0 < (int)local_18b8;
      bVar2 = 0 < (int)local_18c0;
      bVar3 = 0 < (int)local_18c8;
      if ((((bVar3 || (bVar2 || bVar1)) || (0 < (int)local_1910)) || (0 < (int)local_1938)) ||
         ((0 < (int)local_1960 || (0 < (int)local_1990)))) {
        puts("P2/Q2 elements :");
        if (bVar3 || (bVar2 || bVar1)) {
          printf("nbtetP2 = %d; nbtriP2 = %d; nbedgP2 = %d; (nbrdg = %d)\n",local_18b8,local_18c0,
                 local_18c8,local_19a8);
        }
        if ((0 < (int)local_1960 || 0 < (int)local_1990) ||
            (0 < (int)local_1910 || 0 < (int)local_1938)) {
          printf("nbhexQ2 = %d; nbpriP2 = %d; nbpyrP2 = %d; nbquaQ2 = %d\n",local_1910,local_1938,
                 local_1960,local_1990);
        }
      }
      bVar1 = 0 < (int)local_18d0;
      bVar2 = 0 < (int)local_18d8;
      bVar3 = 0 < (int)local_18e0;
      if (((bVar3 || (bVar2 || bVar1)) || (0 < (int)local_1918)) ||
         ((0 < (int)local_1940 || ((0 < (int)local_1968 || (0 < (int)local_1998)))))) {
        puts("P2/Q2 ordering :");
        if (bVar3 || (bVar2 || bVar1)) {
          if (0 < (int)local_18d0) {
            printf("tetP2 ");
          }
          if (0 < (int)local_18d8) {
            printf("triP2 ");
          }
          if (0 < (int)local_18e0) {
            printf("edgP2 ");
          }
          putchar(10);
        }
        if ((0 < (int)local_1968 || 0 < (int)local_1998) ||
            (0 < (int)local_1918 || 0 < (int)local_1940)) {
          if (0 < (int)local_1918) {
            printf("hexQ2 ");
          }
          if (0 < (int)local_1940) {
            printf("priP2 ");
          }
          if (0 < (int)local_1968) {
            printf("pyrP2 ");
          }
          if (0 < (int)local_1998) {
            printf("quaQ2 ");
          }
          putchar(10);
        }
      }
      bVar1 = 0 < (int)local_1888;
      bVar2 = 0 < (int)local_1890;
      bVar3 = 0 < (int)local_1898;
      if ((((bVar3 || (bVar2 || bVar1)) || (0 < local_19c0._0_4_)) || (0 < (int)local_1928)) ||
         ((0 < (int)local_1950 || (0 < (int)local_1980)))) {
        puts("P3/Q3 elements :");
        if (bVar3 || (bVar2 || bVar1)) {
          printf("nbtetP3 = %d; nbtriP3 = %d; nbedgP3 = %d; (nbrdg = %d)\n",local_1888,local_1890,
                 local_1898,local_19a8);
        }
        if ((0 < (int)local_1950 || 0 < (int)local_1980) ||
            (0 < local_19c0._0_4_ || 0 < (int)local_1928)) {
          printf("nbhexQ3 = %d; nbpriP3 = %d; nbpyrP3 = %d; nbquaQ3 = %d\n",local_19c0,local_1928,
                 local_1950,local_1980);
        }
      }
      bVar1 = 0 < (int)local_18a0;
      bVar2 = 0 < (int)local_18a8;
      bVar3 = 0 < (int)local_18b0;
      if (((bVar3 || (bVar2 || bVar1)) || (0 < (int)local_1908)) ||
         ((0 < (int)local_1930 || ((0 < (int)local_1958 || (0 < (int)local_1988)))))) {
        puts("P3/Q3 ordering :");
        if (bVar3 || (bVar2 || bVar1)) {
          if (0 < (int)local_18a0) {
            printf("tetP3 ");
          }
          if (0 < (int)local_18a8) {
            printf("triP3 ");
          }
          if (0 < (int)local_18b0) {
            printf("edgP3 ");
          }
          putchar(10);
        }
        if ((0 < (int)local_1958 || 0 < (int)local_1988) ||
            (0 < (int)local_1908 || 0 < (int)local_1930)) {
          if (0 < (int)local_1908) {
            printf("hexQ3 ");
          }
          if (0 < (int)local_1930) {
            printf("priP3 ");
          }
          if (0 < (int)local_1958) {
            printf("pyrP3 ");
          }
          if (0 < (int)local_1988) {
            printf("quaQ3 ");
          }
          putchar(10);
        }
      }
      bVar1 = 0 < (int)uVar13;
      bVar2 = 0 < (int)local_1860;
      bVar3 = 0 < (int)local_1868;
      iVar17 = (int)uVar4;
      iVar15 = (int)uVar7;
      iVar14 = (int)uVar8;
      if ((((bVar3 || (bVar2 || bVar1)) || (0 < iVar17)) || (0 < iVar15)) ||
         ((0 < iVar14 || (0 < (int)local_1978)))) {
        puts("P4/Q4 elements :");
        if (bVar3 || (bVar2 || bVar1)) {
          printf("nbtetP4 = %d; nbtriP4 = %d; nbedgP4 = %d; (nbrdg = %d)\n",uVar13 & 0xffffffff,
                 local_1860,local_1868,local_19a8);
        }
        if ((0 < iVar14 || 0 < (int)local_1978) || (0 < iVar17 || 0 < iVar15)) {
          printf("nbhexQ4 = %d; nbpriP4 = %d; nbpyrP4 = %d; nbquaQ4 = %d\n",uVar4 & 0xffffffff,
                 uVar7 & 0xffffffff,uVar8 & 0xffffffff,local_1978);
        }
      }
      bVar1 = 0 < (int)local_1870;
      bVar2 = 0 < (int)local_1878;
      bVar3 = 0 < (int)local_1880;
      iVar17 = (int)local_1828;
      iVar14 = (int)local_1830;
      iVar18 = (int)local_1818;
      iVar15 = (int)local_1820;
      if (((bVar3 || (bVar2 || bVar1)) || (0 < iVar17)) ||
         ((0 < iVar14 || ((0 < iVar18 || (0 < iVar15)))))) {
        puts("P4/Q4 ordering :");
        if (bVar3 || (bVar2 || bVar1)) {
          if (0 < (int)local_1870) {
            printf("tetP4 ");
          }
          if (0 < (int)local_1878) {
            printf("triP4 ");
          }
          if (0 < (int)local_1880) {
            printf("edgP4 ");
          }
          putchar(10);
        }
        if ((0 < iVar18 || 0 < iVar15) || (0 < iVar17 || 0 < iVar14)) {
          if (0 < iVar17) {
            printf("hexQ4 ");
          }
          if (0 < iVar14) {
            printf("priP4 ");
          }
          if (0 < iVar18) {
            printf("pyrP4 ");
          }
          if (0 < iVar15) {
            printf("quaQ4 ");
          }
          putchar(10);
        }
      }
      GmfCloseMesh(iVar12);
    }
    else {
      pcVar5 = pcVar5 + (long)(sol + -(long)name);
LAB_001063ec:
      *pcVar5 = '\0';
      iVar12 = GmfOpenMesh(name,1,&FilVer,&dim);
      if (iVar12 != 0) goto LAB_0010645e;
      iVar12 = 0;
    }
    sVar10 = strlen(sol);
    builtin_strncpy(sol + sVar10,".sol",5);
  }
  else {
    iVar12 = 0;
  }
  iVar9 = GmfOpenMesh(sol,1,&FilVer,&dim);
  if (iVar9 == 0) {
    sVar10 = strlen(sol);
    (sol + sVar10)[0] = 'b';
    (sol + sVar10)[1] = '\0';
    bVar1 = false;
    iVar9 = GmfOpenMesh(sol,1,&FilVer,&dim);
    if (iVar9 != 0) goto LAB_0010724a;
  }
  else {
LAB_0010724a:
    puts("Solution informations :");
    iVar11 = GmfStatKwd(iVar9,0x4e);
    local_19c0 = 0.0;
    local_1900 = iVar12;
    if (iVar11 != 0) {
      GmfGotoKwd(iVar9,0x4e);
      if (FilVer == 9) {
        GmfGetLin(iVar9,0x4e,&flt);
        local_19c0 = (double)CONCAT44(uStack_17e4,flt);
      }
      else if (FilVer == 8) {
        GmfGetLin(iVar9,0x4e,&flt);
        local_19c0 = (double)flt;
      }
    }
    iVar12 = GmfStatKwd(iVar9,0x4d);
    if (iVar12 != 0) {
      GmfGotoKwd(iVar9,0x4d);
      GmfGetLin(iVar9,0x4d,&ite);
    }
    printf("dim = %d; ite = %d; time = %lg\n",local_19c0,(ulong)(uint)dim,(ulong)(uint)ite);
    for (lVar20 = 1; lVar20 != 0xf1; lVar20 = lVar20 + 1) {
      pcVar6 = GmfKwdFmt[lVar20][2];
      if ((((*pcVar6 == 'h') || (*pcVar6 == 's')) && (pcVar6[1] == 'r')) &&
         ((pcVar6[2] == '\0' &&
          (uVar13 = GmfStatKwd(iVar9,(int)lVar20,&NbrTyp,&SolSiz,TypTab,&deg,&NmbNod),
          (int)uVar13 != 0)))) {
        printf("%s = %d\n",GmfKwdFmt[lVar20][0],uVar13 & 0xffffffff);
        if (NmbNod != 0 && deg != 1) {
          printf("deg = %d; nbnod = %d\n");
        }
        printf("type = [");
        for (lVar16 = 0; lVar16 < NbrTyp; lVar16 = lVar16 + 1) {
          if (TypTab[lVar16] - 1U < 4) {
            printf(&DAT_0010c410 + *(int *)(&DAT_0010c410 + (ulong)(TypTab[lVar16] - 1U) * 4));
          }
        }
        puts("]");
        deg = 1;
        NmbNod = 0;
      }
    }
    GmfCloseMesh(iVar9);
    bVar1 = true;
    iVar12 = local_1900;
  }
  if (bVar1 || iVar12 != 0) {
    return 0;
  }
  printf("cannot open mesh/solution file %s\n",local_17f0[1]);
LAB_001074c3:
  exit(1);
}

Assistant:

int main(int argc, char *argv[])
{
  int        NmbVer, dim, deg, FilVer, NmbCor, NmbRidg;
  int        NmbTet, NmbHex, NmbPri, NmbPyr, NmbTri, NmbQua, NmbEdg;
  int        NmbTetP2, NmbHexQ2, NmbPriP2, NmbPyrP2, NmbTriP2, NmbQuaQ2, NmbEdgP2, NmbNod;
  int        NmbTetP3, NmbHexQ3, NmbPriP3, NmbPyrP3, NmbTriP3, NmbQuaQ3, NmbEdgP3;
  int        NmbTetP4, NmbHexQ4, NmbPriP4, NmbPyrP4, NmbTriP4, NmbQuaQ4, NmbEdgP4;
  int        OrdTet, OrdHex, OrdPri, OrdPyr, OrdTri, OrdQua, OrdEdg;
  int        OrdTetP2, OrdHexQ2, OrdPriP2, OrdPyrP2, OrdTriP2, OrdQuaQ2, OrdEdgP2;
  int        OrdTetP3, OrdHexQ3, OrdPriP3, OrdPyrP3, OrdTriP3, OrdQuaQ3, OrdEdgP3;
  int        OrdTetP4, OrdHexQ4, OrdPriP4, OrdPyrP4, OrdTriP4, OrdQuaQ4, OrdEdgP4;
  int64_t    InpMsh = 0, InpSol = 0;
  int        i, j, ite = 0;
  float      flt;
  double     dbl, time = 0.0;
  int        NbrLin, SolSiz, NbrTyp, TypTab[ GmfMaxTyp ];
  

  deg    = 1;
  NmbNod = 0;


  if (argc <= 1) {
    printf(" USAGE : mshinfo name [-check]\n");
    exit(1);
  }

  char name[1024];
  char sol[1024];

  strcpy(name,argv[1]);
  strcpy(sol,argv[1]);


  char *sub = NULL;
  sub = strstr(name,".mesh"); // check if it has the extension .mesh[b]


  char *subsol = NULL;
  subsol = strstr(name,".sol"); // check if it has the extension .sol[b]

// Mesh part

//-- test the reading of the file as a mesh
  if (subsol == NULL) { //--- no extension sol[b], check if it is a mesh name without extnsion
    if(sub != NULL) sol[sub-name]='\0'; // change file name to be opened as sol even if mesh extension is given

    if (sub != NULL)
      InpMsh = GmfOpenMesh(name, GmfRead, &FilVer, &dim);
    else {
      strcat(name,".meshb");
      InpMsh = GmfOpenMesh(name, GmfRead, &FilVer, &dim);
      if(InpMsh == 0){
        int ln = strlen(name);
        name[ln -1] = '\0';
        InpMsh = GmfOpenMesh(name, GmfRead, &FilVer, &dim);
      }
    }
  }

  if ( InpMsh != 0 && subsol == NULL ) {
    printf("Mesh informations :\n");
   /* Get number of entities*/
       
    NmbVer   = GmfStatKwd(InpMsh, GmfVertices);
    NmbCor   = GmfStatKwd(InpMsh, GmfCorners);
    NmbRidg  = GmfStatKwd(InpMsh, GmfRidges);
    NmbTet   = GmfStatKwd(InpMsh, GmfTetrahedra);
    NmbHex   = GmfStatKwd(InpMsh, GmfHexahedra);
    NmbPyr   = GmfStatKwd(InpMsh, GmfPyramids);
    NmbPri   = GmfStatKwd(InpMsh, GmfPrisms);
    NmbTri   = GmfStatKwd(InpMsh, GmfTriangles);
    NmbQua   = GmfStatKwd(InpMsh, GmfQuadrilaterals);
    NmbEdg   = GmfStatKwd(InpMsh, GmfEdges);
    NmbTetP2 = GmfStatKwd(InpMsh, GmfTetrahedraP2);
    NmbHexQ2 = GmfStatKwd(InpMsh, GmfHexahedraQ2);
    NmbPyrP2 = GmfStatKwd(InpMsh, GmfPyramidsP2);
    NmbPriP2 = GmfStatKwd(InpMsh, GmfPrismsP2);
    NmbTriP2 = GmfStatKwd(InpMsh, GmfTrianglesP2);
    NmbQuaQ2 = GmfStatKwd(InpMsh, GmfQuadrilateralsQ2);
    NmbEdgP2 = GmfStatKwd(InpMsh, GmfEdgesP2);
    NmbTetP3 = GmfStatKwd(InpMsh, GmfTetrahedraP3);
    NmbHexQ3 = GmfStatKwd(InpMsh, GmfHexahedraQ3);
    NmbPyrP3 = GmfStatKwd(InpMsh, GmfPyramidsP3);
    NmbPriP3 = GmfStatKwd(InpMsh, GmfPrismsP3);
    NmbTriP3 = GmfStatKwd(InpMsh, GmfTrianglesP3);
    NmbQuaQ3 = GmfStatKwd(InpMsh, GmfQuadrilateralsQ3);
    NmbEdgP3 = GmfStatKwd(InpMsh, GmfEdgesP3);
    NmbTetP4 = GmfStatKwd(InpMsh, GmfTetrahedraP4);
    NmbHexQ4 = GmfStatKwd(InpMsh, GmfHexahedraQ4);
    NmbPyrP4 = GmfStatKwd(InpMsh, GmfPyramidsP4);
    NmbPriP4 = GmfStatKwd(InpMsh, GmfPrismsP4);
    NmbTriP4 = GmfStatKwd(InpMsh, GmfTrianglesP4);
    NmbQuaQ4 = GmfStatKwd(InpMsh, GmfQuadrilateralsQ4);
    NmbEdgP4 = GmfStatKwd(InpMsh, GmfEdgesP4);

    //-- Nodes ordering
    OrdTet   = GmfStatKwd(InpMsh, GmfTetrahedraP1Ordering);
    OrdHex   = GmfStatKwd(InpMsh, GmfHexahedraQ1Ordering);
    OrdPyr   = GmfStatKwd(InpMsh, GmfPyramidsP1Ordering);
    OrdPri   = GmfStatKwd(InpMsh, GmfPrismsP1Ordering);
    OrdTri   = GmfStatKwd(InpMsh, GmfTrianglesP1Ordering);
    OrdQua   = GmfStatKwd(InpMsh, GmfQuadrilateralsQ1Ordering);
    OrdEdg   = GmfStatKwd(InpMsh, GmfEdgesP1Ordering);
    OrdTetP2 = GmfStatKwd(InpMsh, GmfTetrahedraP2Ordering);
    OrdHexQ2 = GmfStatKwd(InpMsh, GmfHexahedraQ2Ordering);
    OrdPyrP2 = GmfStatKwd(InpMsh, GmfPyramidsP2Ordering);
    OrdPriP2 = GmfStatKwd(InpMsh, GmfPrismsP2Ordering);
    OrdTriP2 = GmfStatKwd(InpMsh, GmfTrianglesP2Ordering);
    OrdQuaQ2 = GmfStatKwd(InpMsh, GmfQuadrilateralsQ2Ordering);
    OrdEdgP2 = GmfStatKwd(InpMsh, GmfEdgesP2Ordering);
    OrdTetP3 = GmfStatKwd(InpMsh, GmfTetrahedraP3Ordering);
    OrdHexQ3 = GmfStatKwd(InpMsh, GmfHexahedraQ3Ordering);
    OrdPyrP3 = GmfStatKwd(InpMsh, GmfPyramidsP3Ordering);
    OrdPriP3 = GmfStatKwd(InpMsh, GmfPrismsP3Ordering);
    OrdTriP3 = GmfStatKwd(InpMsh, GmfTrianglesP3Ordering);
    OrdQuaQ3 = GmfStatKwd(InpMsh, GmfQuadrilateralsQ3Ordering);
    OrdEdgP3 = GmfStatKwd(InpMsh, GmfEdgesP3Ordering);
    OrdTetP4 = GmfStatKwd(InpMsh, GmfTetrahedraP4Ordering);
    OrdHexQ4 = GmfStatKwd(InpMsh, GmfHexahedraQ4Ordering);
    OrdPyrP4 = GmfStatKwd(InpMsh, GmfPyramidsP4Ordering);
    OrdPriP4 = GmfStatKwd(InpMsh, GmfPrismsP4Ordering);
    OrdTriP4 = GmfStatKwd(InpMsh, GmfTrianglesP4Ordering);
    OrdQuaQ4 = GmfStatKwd(InpMsh, GmfQuadrilateralsQ4Ordering);
    OrdEdgP4 = GmfStatKwd(InpMsh, GmfEdgesP4Ordering);
 
    printf("version = %d; dim = %d; nbv = %d; (nbc = %d)\n", FilVer, dim, NmbVer, NmbCor);
    
    if ( NmbTet > 0 || NmbTri > 0 || NmbEdg > 0 || NmbHex > 0|| NmbPri > 0 || NmbPyr > 0|| NmbQua > 0 ) {
      printf("P1/Q1 elements :\n");
      if ( NmbTet >0 || NmbTri > 0 || NmbEdg > 0 ) 
        printf("nbtet = %d; nbtri = %d; nbedg = %d; (nbrdg = %d)\n", NmbTet, NmbTri, NmbEdg, NmbRidg);
      if ( NmbHex > 0|| NmbPri > 0 || NmbPyr > 0|| NmbQua > 0 )
        printf("nbhex = %d; nbpri = %d; nbpyr = %d; nbqua = %d\n", NmbHex, NmbPri, NmbPyr, NmbQua);
    }
    
    if ( OrdTet >0 || OrdTri > 0 || OrdEdg > 0 || OrdHex > 0|| OrdPri > 0 || OrdPyr > 0|| OrdQua > 0 ) {
      printf("P1/Q1 ordering :\n");
      if ( OrdTet > 0 || OrdTri > 0 || OrdEdg > 0 ) {
        if ( OrdTet > 0 )
          printf("tet ");
        if ( OrdTri > 0 )
          printf("tri ");
        if ( OrdEdg > 0 )
          printf("edg ");
        printf("\n");
      }
      if ( OrdHex > 0|| OrdPri > 0 || OrdPyr > 0|| OrdQua > 0 ) {
        if ( OrdHex > 0 )
          printf("hex ");
        if ( OrdPri > 0 )
          printf("pri ");
        if ( OrdPyr > 0 )
          printf("pyr ");
        if ( OrdQua > 0 )
          printf("qua ");
        printf("\n");
      }
    }

    if ( NmbTetP2 > 0 || NmbTriP2 > 0 || NmbEdgP2 > 0 || NmbHexQ2 > 0|| NmbPriP2 > 0 || NmbPyrP2 > 0|| NmbQuaQ2 > 0 ) {
      printf("P2/Q2 elements :\n"); 
      if ( NmbTetP2 > 0 || NmbTriP2 > 0 || NmbEdgP2 > 0 )
        printf("nbtetP2 = %d; nbtriP2 = %d; nbedgP2 = %d; (nbrdg = %d)\n", NmbTetP2, NmbTriP2, NmbEdgP2, NmbRidg);
      if ( NmbHexQ2 > 0|| NmbPriP2 > 0 || NmbPyrP2 > 0|| NmbQuaQ2 > 0 )
        printf("nbhexQ2 = %d; nbpriP2 = %d; nbpyrP2 = %d; nbquaQ2 = %d\n", NmbHexQ2, NmbPriP2, NmbPyrP2, NmbQuaQ2);
    }
    
    if ( OrdTetP2 >0 || OrdTriP2 > 0 || OrdEdgP2 > 0 || OrdHexQ2 > 0|| OrdPriP2 > 0 || OrdPyrP2 > 0|| OrdQuaQ2 > 0 ) {
      printf("P2/Q2 ordering :\n");
      if ( OrdTetP2 > 0 || OrdTriP2 > 0 || OrdEdgP2 > 0 ) {
        if ( OrdTetP2 > 0 )
          printf("tetP2 ");
        if ( OrdTriP2 > 0 )
          printf("triP2 ");
        if ( OrdEdgP2 > 0 )
          printf("edgP2 ");
        printf("\n");
      }
      if ( OrdHexQ2 > 0|| OrdPriP2 > 0 || OrdPyrP2 > 0|| OrdQuaQ2 > 0 ) {
        if ( OrdHexQ2 > 0 )
          printf("hexQ2 ");
        if ( OrdPriP2 > 0 )
          printf("priP2 ");
        if ( OrdPyrP2 > 0 )
          printf("pyrP2 ");
        if ( OrdQuaQ2 > 0 )
          printf("quaQ2 ");
        printf("\n");
      }
    }

    if ( NmbTetP3 > 0 || NmbTriP3 > 0 || NmbEdgP3 > 0 || NmbHexQ3 > 0|| NmbPriP3 > 0 || NmbPyrP3 > 0|| NmbQuaQ3 > 0 ) {
      printf("P3/Q3 elements :\n"); 
      if ( NmbTetP3 > 0 || NmbTriP3 > 0 || NmbEdgP3 > 0 )
        printf("nbtetP3 = %d; nbtriP3 = %d; nbedgP3 = %d; (nbrdg = %d)\n", NmbTetP3, NmbTriP3, NmbEdgP3, NmbRidg);
      if ( NmbHexQ3 > 0|| NmbPriP3 > 0 || NmbPyrP3 > 0|| NmbQuaQ3 > 0 )
        printf("nbhexQ3 = %d; nbpriP3 = %d; nbpyrP3 = %d; nbquaQ3 = %d\n", NmbHexQ3, NmbPriP3, NmbPyrP3, NmbQuaQ3);
    }

    if ( OrdTetP3 >0 || OrdTriP3 > 0 || OrdEdgP3 > 0 || OrdHexQ3 > 0|| OrdPriP3 > 0 || OrdPyrP3 > 0|| OrdQuaQ3 > 0 ) {
      printf("P3/Q3 ordering :\n");
      if ( OrdTetP3 > 0 || OrdTriP3 > 0 || OrdEdgP3 > 0 ) {
        if ( OrdTetP3 > 0 )
          printf("tetP3 ");
        if ( OrdTriP3 > 0 )
          printf("triP3 ");
        if ( OrdEdgP3 > 0 )
          printf("edgP3 ");
        printf("\n");
      }
      if ( OrdHexQ3 > 0|| OrdPriP3 > 0 || OrdPyrP3 > 0|| OrdQuaQ3 > 0 ) {
        if ( OrdHexQ3 > 0 )
          printf("hexQ3 ");
        if ( OrdPriP3 > 0 )
          printf("priP3 ");
        if ( OrdPyrP3 > 0 )
          printf("pyrP3 ");
        if ( OrdQuaQ3 > 0 )
          printf("quaQ3 ");
        printf("\n");
      }
    }

    if ( NmbTetP4 > 0 || NmbTriP4 > 0 || NmbEdgP4 > 0 || NmbHexQ4 > 0|| NmbPriP4 > 0 || NmbPyrP4 > 0|| NmbQuaQ4 > 0 ) {
      printf("P4/Q4 elements :\n"); 
      if ( NmbTetP4 > 0 || NmbTriP4 > 0 || NmbEdgP4 > 0 )
        printf("nbtetP4 = %d; nbtriP4 = %d; nbedgP4 = %d; (nbrdg = %d)\n", NmbTetP4, NmbTriP4, NmbEdgP4, NmbRidg);
      if ( NmbHexQ4 > 0|| NmbPriP4 > 0 || NmbPyrP4 > 0|| NmbQuaQ4 > 0 )
        printf("nbhexQ4 = %d; nbpriP4 = %d; nbpyrP4 = %d; nbquaQ4 = %d\n", NmbHexQ4, NmbPriP4, NmbPyrP4, NmbQuaQ4);
    }

    if ( OrdTetP4 >0 || OrdTriP4 > 0 || OrdEdgP4 > 0 || OrdHexQ4 > 0|| OrdPriP4 > 0 || OrdPyrP4 > 0|| OrdQuaQ4 > 0 ) {
      printf("P4/Q4 ordering :\n");
      if ( OrdTetP4 > 0 || OrdTriP4 > 0 || OrdEdgP4 > 0 ) {
        if ( OrdTetP4 > 0 )
          printf("tetP4 ");
        if ( OrdTriP4 > 0 )
          printf("triP4 ");
        if ( OrdEdgP4 > 0 )
          printf("edgP4 ");
        printf("\n");
      }
      if ( OrdHexQ4 > 0|| OrdPriP4 > 0 || OrdPyrP4 > 0|| OrdQuaQ4 > 0 ) {
        if ( OrdHexQ4 > 0 )
          printf("hexQ4 ");
        if ( OrdPriP4 > 0 )
          printf("priP4 ");
        if ( OrdPyrP4 > 0 )
          printf("pyrP4 ");
        if ( OrdQuaQ4 > 0 )
          printf("quaQ4 ");
        printf("\n");
      }
    }

    GmfCloseMesh(InpMsh);
     
  }
  

  // solution part

//-- test the reading of the file as a solution
  if (subsol != NULL) { //--- a file containing char ".sol" is given in input
    InpSol = GmfOpenMesh(sol, GmfRead, &FilVer, &dim);
    if ( InpSol == 0 ) {
      strcat(sol,"b");
      InpSol = GmfOpenMesh(sol, GmfRead, &FilVer, &dim);
    }
  }
  else { //-- check if a solution with the same name as the mesh one exists
    strcat(sol,".sol");
    InpSol = GmfOpenMesh(sol, GmfRead, &FilVer, &dim);
    if ( InpSol == 0 ) {
      strcat(sol,"b");
      InpSol = GmfOpenMesh(sol, GmfRead, &FilVer, &dim);
    }
  }

  if (InpSol!= 0 ) {
    printf("Solution informations :\n");
    if ( GmfStatKwd(InpSol, GmfTime) ) {
      GmfGotoKwd(InpSol, GmfTime);
      if ( FilVer == GmfFloat ) {	// read 32 bits float
       GmfGetLin(InpSol, GmfTime, &flt);
       time = (double)flt;
      }  
      else if ( FilVer == GmfDouble ) {	// read 64 bits float
        GmfGetLin(InpSol, GmfTime, &dbl);
        time = dbl;
      }
    }
    if ( GmfStatKwd(InpSol, GmfIterations) ) {
      GmfGotoKwd(InpSol, GmfIterations);
      GmfGetLin( InpSol, GmfIterations, &ite);  
    }  
    printf("dim = %d; ite = %d; time = %lg\n",dim, ite, time);
    for(i=1; i<=GmfMaxKwd; i++) {
      if( ( (!strcmp(GmfKwdFmt[i][2], "sr")  || !strcmp(GmfKwdFmt[i][2], "hr")) ) && ( (NbrLin = GmfStatKwd(InpSol, i, &NbrTyp, &SolSiz, TypTab, &deg, &NmbNod)) ) ) {
        printf("%s = %d\n", GmfKwdFmt[i][0], NbrLin);
        if ( deg != 1 && NmbNod != 0 )
          printf("deg = %d; nbnod = %d\n",deg, NmbNod);
        printf("type = [");
        for(j=0; j<NbrTyp; j++) {
          if (      TypTab[j] == 1 ) printf(" scalar ");
          else if ( TypTab[j] == 2 ) printf(" vector ");
          else if ( TypTab[j] == 3 ) printf(" metric ");
          else if ( TypTab[j] == 4 ) printf(" matrix ");
        }
        printf("]\n");
        deg = 1;
        NmbNod = 0;
      }
    }
    GmfCloseMesh(InpSol);
  }

  if ( InpSol == 0 && InpMsh == 0 ) {
    printf("cannot open mesh/solution file %s\n", argv[1]);
    exit(1);
  }

  return(0);

}